

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiStackLevelInfo *__dest;
  long lVar6;
  ImGuiStackLevelInfo *pIVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ImGuiContext *ctx;
  int iVar13;
  int iVar14;
  
  pIVar5 = GImGui;
  uVar11 = (ulong)id;
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (GImGui->DebugStackTool).StackLevel;
  lVar10 = (long)iVar2;
  if (lVar10 == -1) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar2 = (pIVar4->IDStack).Size;
    iVar3 = (pIVar5->DebugStackTool).Results.Capacity;
    iVar14 = (int)((long)iVar2 + 1);
    if (iVar3 <= iVar2) {
      if (iVar3 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar3 / 2 + iVar3;
      }
      if (iVar13 <= iVar14) {
        iVar13 = iVar14;
      }
      if (iVar3 < iVar13) {
        if (pIVar5 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiStackLevelInfo *)
                 (*GImAllocatorAllocFunc)((long)iVar13 << 6,GImAllocatorUserData);
        pIVar7 = (pIVar5->DebugStackTool).Results.Data;
        if (pIVar7 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest,pIVar7,(long)(pIVar5->DebugStackTool).Results.Size << 6);
          pIVar7 = (pIVar5->DebugStackTool).Results.Data;
          if ((pIVar7 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
        }
        (pIVar5->DebugStackTool).Results.Data = __dest;
        (pIVar5->DebugStackTool).Results.Capacity = iVar13;
      }
    }
    iVar3 = (pIVar5->DebugStackTool).Results.Size;
    if (iVar3 <= iVar2) {
      lVar6 = ((long)iVar2 + 1) - (long)iVar3;
      lVar10 = (long)iVar3 << 6;
      do {
        pIVar7 = (pIVar5->DebugStackTool).Results.Data;
        pcVar9 = pIVar7->Desc + lVar10 + 0x29;
        pcVar9[0] = '\0';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        pcVar9[4] = '\0';
        pcVar9[5] = '\0';
        pcVar9[6] = '\0';
        pcVar9[7] = '\0';
        pcVar9[8] = '\0';
        pcVar9[9] = '\0';
        pcVar9[10] = '\0';
        pcVar9[0xb] = '\0';
        pcVar9[0xc] = '\0';
        pcVar9[0xd] = '\0';
        pcVar9[0xe] = '\0';
        pcVar9[0xf] = '\0';
        pcVar9 = pIVar7->Desc + lVar10 + 0x19;
        pcVar9[0] = '\0';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        pcVar9[4] = '\0';
        pcVar9[5] = '\0';
        pcVar9[6] = '\0';
        pcVar9[7] = '\0';
        pcVar9[8] = '\0';
        pcVar9[9] = '\0';
        pcVar9[10] = '\0';
        pcVar9[0xb] = '\0';
        pcVar9[0xc] = '\0';
        pcVar9[0xd] = '\0';
        pcVar9[0xe] = '\0';
        pcVar9[0xf] = '\0';
        pcVar9 = pIVar7->Desc + lVar10 + 9;
        pcVar9[0] = '\0';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        pcVar9[4] = '\0';
        pcVar9[5] = '\0';
        pcVar9[6] = '\0';
        pcVar9[7] = '\0';
        pcVar9[8] = '\0';
        pcVar9[9] = '\0';
        pcVar9[10] = '\0';
        pcVar9[0xb] = '\0';
        pcVar9[0xc] = '\0';
        pcVar9[0xd] = '\0';
        pcVar9[0xe] = '\0';
        pcVar9[0xf] = '\0';
        pcVar9 = pIVar7->Desc + lVar10 + -7;
        pcVar9[0] = '\0';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        pcVar9[4] = '\0';
        pcVar9[5] = '\0';
        pcVar9[6] = '\0';
        pcVar9[7] = '\0';
        pcVar9[8] = '\0';
        pcVar9[9] = '\0';
        pcVar9[10] = '\0';
        pcVar9[0xb] = '\0';
        pcVar9[0xc] = '\0';
        pcVar9[0xd] = '\0';
        pcVar9[0xe] = '\0';
        pcVar9[0xf] = '\0';
        lVar10 = lVar10 + 0x40;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    (pIVar5->DebugStackTool).Results.Size = iVar14;
    iVar2 = (pIVar4->IDStack).Size;
    if ((long)iVar2 < 0) {
      return;
    }
    pIVar7 = (pIVar5->DebugStackTool).Results.Data;
    uVar11 = 0;
    do {
      uVar12 = id;
      if (uVar11 < (ulong)(long)iVar2) {
        uVar12 = (pIVar4->IDStack).Data[uVar11];
      }
      pIVar7->ID = uVar12;
      uVar11 = uVar11 + 1;
      pIVar7 = pIVar7 + 1;
    } while (iVar2 + 1 != uVar11);
    return;
  }
  if (iVar2 != (pIVar4->IDStack).Size) {
    return;
  }
  pIVar7 = (GImGui->DebugStackTool).Results.Data;
  switch(data_type) {
  case 4:
    pcVar9 = "%d";
    uVar11 = (ulong)data_id & 0xffffffff;
    goto LAB_0010de39;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar8 = strlen((char *)data_id);
    }
    else {
      sVar8 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar7[lVar10].Desc,0x39,"%.*s",sVar8,data_id);
    break;
  case 0xc:
    ImFormatString(pIVar7[lVar10].Desc,0x39,"(void*)0x%p",data_id);
    break;
  case 0xd:
    if (pIVar7[lVar10].Desc[0] != '\0') {
      return;
    }
    pcVar9 = "0x%08X [override]";
LAB_0010de39:
    ImFormatString(pIVar7[lVar10].Desc,0x39,pcVar9,uVar11);
  }
  pIVar7[lVar10].QuerySuccess = true;
  pIVar7[lVar10].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assume that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}